

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void __thiscall ByteCodeGenerator::StartEmitFunction(ByteCodeGenerator *this,ParseNodeFnc *pnodeFnc)

{
  undefined1 *puVar1;
  ParseNode *pPVar2;
  long lVar3;
  ParseNodeBlock *pPVar4;
  code *pcVar5;
  anon_class_24_3_c793ac44 handler;
  anon_class_24_3_c793ac44 handler_00;
  bool bVar6;
  ushort uVar7;
  uint uVar8;
  LocalFunctionId LVar9;
  RegSlot RVar10;
  undefined4 *puVar11;
  FunctionBody *pFVar12;
  ByteBlock *pBVar13;
  Symbol *pSVar14;
  ParseNodeVar *pPVar15;
  ParseNodePtr pPVar16;
  ParseNodeParamPattern *pPVar17;
  ScriptContext *pSVar18;
  ParseNodePtr *ppPVar19;
  char *pcVar20;
  ByteCodeGenerator *pBVar21;
  uint uVar22;
  Scope *pSVar23;
  ScriptContext *pSVar24;
  ArenaMemoryData *innerScope;
  anon_class_16_2_85211fcd handler_01;
  anon_class_16_2_85211fcd handler_02;
  anon_class_16_2_85211fcd handler_03;
  anon_class_16_2_85211fcd handler_04;
  undefined1 local_72 [2];
  undefined1 auStack_70 [6];
  ArgSlot pos;
  ByteCodeGenerator *pBStack_68;
  ByteCodeGenerator *local_60;
  FuncInfo **local_58;
  Scope *local_50;
  undefined1 local_48 [8];
  Symbol *sym;
  ScriptContext *local_38;
  FuncInfo *funcInfo;
  
  if (((pnodeFnc->super_ParseNode).nop | knopInt) != knopProg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0xdb5,"(pnodeFnc->nop == knopFncDecl || pnodeFnc->nop == knopProg)",
                       "pnodeFnc->nop == knopFncDecl || pnodeFnc->nop == knopProg");
    if (!bVar6) goto LAB_007638ac;
    *puVar11 = 0;
  }
  pSVar24 = (ScriptContext *)pnodeFnc->funcInfo;
  local_50 = (Scope *)(pSVar24->dynamicProfileInfoAllocator).
                      super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.name;
  innerScope = (pSVar24->dynamicProfileInfoAllocator).
               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.memoryData;
  local_38 = pSVar24;
  bVar6 = Js::ParseableFunctionInfo::IsFunctionParsed
                    ((ParseableFunctionInfo *)
                     (pSVar24->dynamicProfileInfoAllocator).
                     super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                     freeList);
  if ((bVar6) &&
     (*(long *)((pSVar24->dynamicProfileInfoAllocator).
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                freeListSize + 0x58) != 0)) {
    pFVar12 = FuncInfo::GetParsedFunctionBody((FuncInfo *)pSVar24);
    pBVar13 = Js::FunctionBody::GetByteCode(pFVar12);
    if ((pBVar13 == (ByteBlock *)0x0) && ((this->flags & 0x404) == 0)) {
      pFVar12 = FuncInfo::GetParsedFunctionBody((FuncInfo *)pSVar24);
      pFVar12->m_envDepth = this->envDepth;
    }
    if (((ulong)(pSVar24->calleeUtf8SourceInfoList).ptr & 0x200000000) != 0) {
      lVar3 = (long)(pSVar24->dynamicProfileInfoAllocator).
                    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                    freeList + 0x47;
      *(byte *)lVar3 = *(byte *)lVar3 | 8;
    }
    pSVar23 = *(Scope **)
               &(pSVar24->dynamicProfileInfoAllocator).
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                needsDelayFreeList;
    if (pSVar23 != (Scope *)0x0) {
      if ((((ulong)(pSVar24->calleeUtf8SourceInfoList).ptr & 0x200000000) != 0) &&
         ((pSVar23->field_0x44 & 2) == 0)) {
        AssertCount = AssertCount + 1;
        sym = (Symbol *)innerScope;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0xdcd,"(funcExprScope->GetIsObject())","funcExprScope->GetIsObject()");
        if (!bVar6) goto LAB_007638ac;
        *puVar11 = 0;
        innerScope = (ArenaMemoryData *)sym;
      }
      if ((*(ushort *)&pSVar23->field_0x44 & 2) == 0) {
        pSVar14 = ParseNodeFnc::GetFuncSymbol
                            ((ParseNodeFnc *)
                             (pSVar24->dynamicProfileInfoAllocator).
                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                             .freeListSize);
        Scope::AddSymbol((Scope *)(&(pSVar24->dynamicProfileInfoAllocator).
                                    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                    .name)[*(ushort *)
                                            ((long)&(pSVar24->calleeUtf8SourceInfoList).ptr + 4) >>
                                           0xf],pSVar14);
        Symbol::EnsureScopeSlot(pSVar14,this,(FuncInfo *)pSVar24);
        if ((pSVar14->field_0x42 & 0x10) != 0) {
          puVar1 = &pSVar14->scope->field_0x44;
          *(ushort *)puVar1 = *(ushort *)puVar1 | 0x100;
        }
      }
      else {
        *(ushort *)&pSVar23->field_0x44 = *(ushort *)&pSVar23->field_0x44 | 0x18;
        PushScope(this,pSVar23);
      }
    }
    pSVar23 = local_50;
    if ((pnodeFnc->super_ParseNode).nop == knopProg) {
      if ((((*(byte *)((long)(pSVar24->dynamicProfileInfoAllocator).
                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                             .freeList + 0x46) & 1) != 0) && ((this->flags & 0x400) != 0)) &&
         ((*(byte *)((long)&innerScope->resetCount + 4) & 2) == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0xef6,"(bodyScope->GetIsObject())","bodyScope->GetIsObject()");
        if (!bVar6) goto LAB_007638ac;
        *puVar11 = 0;
      }
    }
    else {
      uVar7 = *(ushort *)((long)&innerScope->resetCount + 4);
      if ((uVar7 & 2) == 0) {
        bVar6 = NeedObjectAsFunctionScope(this,(FuncInfo *)pSVar24,pnodeFnc);
        uVar7 = *(ushort *)((long)&innerScope->resetCount + 4);
        if ((bVar6) && ((uVar7 & 2) == 0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar11 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0xded,"(bodyScope->GetIsObject())","bodyScope->GetIsObject()");
          if (!bVar6) goto LAB_007638ac;
          *puVar11 = 0;
          uVar7 = *(ushort *)((long)&innerScope->resetCount + 4);
          pSVar23 = local_50;
        }
      }
      *(RegSlot *)&innerScope->requestBytes =
           *(RegSlot *)((long)&pSVar24->DeferredParsingThunk + (ulong)((uVar7 & 2) == 0) * 4);
      if (((ulong)(pSVar24->calleeUtf8SourceInfoList).ptr & 0x800000000000) == 0) {
        pSVar23->location =
             *(RegSlot *)
              ((long)&pSVar24->DeferredParsingThunk +
              (ulong)((*(ushort *)&pSVar23->field_0x44 & 2) == 0) * 4);
      }
      sym = (Symbol *)innerScope;
      if ((*(byte *)((long)&innerScope->resetCount + 4) & 2) == 0) {
        _auStack_70 = this;
        pBStack_68 = (ByteCodeGenerator *)&stack0xffffffffffffffc8;
        StartEmitFunction::anon_class_16_2_85211fcd::operator()
                  ((anon_class_16_2_85211fcd *)auStack_70,pnodeFnc->pnodeScopes->pnodeScopes);
        if (pnodeFnc->pnodeBodyScope != (ParseNodeBlock *)0x0) {
          StartEmitFunction::anon_class_16_2_85211fcd::operator()
                    ((anon_class_16_2_85211fcd *)auStack_70,pnodeFnc->pnodeBodyScope->pnodeScopes);
        }
        ppPVar19 = &pnodeFnc->pnodeVars;
        while (pPVar2 = *ppPVar19, pPVar2 != (ParseNode *)0x0) {
          pPVar15 = ParseNode::AsParseNodeVar(pPVar2);
          local_48 = (undefined1  [8])pPVar15->sym;
          pPVar15 = ParseNode::AsParseNodeVar(pPVar2);
          uVar7 = *(ushort *)
                   &((ScriptContextOptimizationOverrideInfo *)((long)local_48 + 0x40))->field_0x2;
          if ((pPVar15->isBlockScopeFncDeclVar == '\0') || ((uVar7 & 2) == 0)) {
            if (((uVar7 & 0x40) != 0) || (((uVar7 & 2) != 0 && (pPVar2->nop == knopVarDecl)))) {
              local_48 = (undefined1  [8])
                         Scope::FindLocalSymbol
                                   ((Scope *)(local_38->dynamicProfileInfoAllocator).
                                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                             .memoryData,(SymbolName *)local_48);
            }
            if (((((ScriptContextOptimizationOverrideInfo *)((long)local_48 + 0x40))->sideEffects ==
                  STVariable) &&
                (bVar6 = Symbol::NeedsSlotAlloc((Symbol *)local_48,this,(FuncInfo *)local_38), bVar6
                )) && (bVar6 = Symbol::IsArguments((Symbol *)local_48), !bVar6)) {
              Symbol::EnsureScopeSlot((Symbol *)local_48,this,(FuncInfo *)local_38);
            }
          }
          pPVar15 = ParseNode::AsParseNodeVar(pPVar2);
          ppPVar19 = &pPVar15->pnodeNext;
        }
        _auStack_70 = (ByteCodeGenerator *)local_48;
        pBStack_68 = this;
        local_60 = (ByteCodeGenerator *)&stack0xffffffffffffffc8;
        for (pPVar16 = pnodeFnc->pnodeParams; pPVar16 != (ParseNode *)0x0;
            pPVar16 = ParseNode::GetFormalNext(pPVar16)) {
          StartEmitFunction::anon_class_24_3_c793ac44::operator()
                    ((anon_class_24_3_c793ac44 *)auStack_70,pPVar16);
        }
        if (pnodeFnc->pnodeRest != (ParseNode *)0x0) {
          StartEmitFunction::anon_class_24_3_c793ac44::operator()
                    ((anon_class_24_3_c793ac44 *)auStack_70,pnodeFnc->pnodeRest);
        }
        innerScope = (ArenaMemoryData *)sym;
        local_60 = (ByteCodeGenerator *)&stack0xffffffffffffffc8;
        _auStack_70 = (ByteCodeGenerator *)local_48;
        pBStack_68 = this;
        for (pPVar16 = pnodeFnc->pnodeParams; pPVar16 != (ParseNode *)0x0;
            pPVar16 = ParseNode::GetFormalNext(pPVar16)) {
          if (pPVar16->nop == knopParamPattern) {
            pPVar17 = ParseNode::AsParseNodeParamPattern(pPVar16);
            handler.this = pBStack_68;
            handler.sym = (Symbol **)_auStack_70;
            handler.funcInfo = (FuncInfo **)local_60;
            Parser::MapBindIdentifier<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__6>
                      ((pPVar17->super_ParseNodeUni).pnode1,handler);
          }
        }
        pPVar2 = pnodeFnc->pnodeRest;
        if ((pPVar2 != (ParseNode *)0x0) && (pPVar2->nop == knopParamPattern)) {
          pPVar17 = ParseNode::AsParseNodeParamPattern(pPVar2);
          handler_00.this = pBStack_68;
          handler_00.sym = (Symbol **)_auStack_70;
          handler_00.funcInfo = (FuncInfo **)local_60;
          Parser::MapBindIdentifier<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__6>
                    ((pPVar17->super_ParseNodeUni).pnode1,handler_00);
        }
        pSVar23 = local_50;
        if (((ulong)(local_38->calleeUtf8SourceInfoList).ptr & 0x800000000) != 0) {
          local_48 = (undefined1  [8])
                     (local_38->isInstInlineCacheAllocator).
                     super_ArenaAllocatorBase<Memory::StandAloneFreeListPolicy,_4UL,_false,_0UL>.
                     super_ArenaData.fullBlocks;
          if (local_48 == (undefined1  [8])0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar11 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0xec5,"(sym)","sym");
            if (!bVar6) goto LAB_007638ac;
            *puVar11 = 0;
            innerScope = (ArenaMemoryData *)sym;
          }
          Symbol::EnsureScopeSlot((Symbol *)local_48,this,(FuncInfo *)local_38);
        }
        if (pnodeFnc->pnodeBody != (ParseNodePtr)0x0) {
          EnsureLetConstScopeSlots(this,pnodeFnc->pnodeScopes,(FuncInfo *)local_38);
LAB_007636cc:
          EnsureLetConstScopeSlots(this,pnodeFnc->pnodeBodyScope,(FuncInfo *)local_38);
        }
      }
      else {
        uVar8 = Js::FunctionProxy::GetSourceContextId
                          ((FunctionProxy *)
                           (pSVar24->dynamicProfileInfoAllocator).
                           super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                           freeList);
        LVar9 = Js::FunctionProxy::GetLocalFunctionId
                          ((FunctionProxy *)
                           (pSVar24->dynamicProfileInfoAllocator).
                           super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                           freeList);
        pcVar20 = (char *)(ulong)LVar9;
        bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,CachedScopePhase,uVar8,LVar9);
        innerScope = (ArenaMemoryData *)sym;
        uVar22 = 0;
        if ((((!bVar6) && (((ulong)(pSVar24->calleeUtf8SourceInfoList).ptr & 0x80000000000) == 0))
            && (*(RegSlot *)&pSVar24->DeferredParsingThunk != 0xffffffff)) &&
           (((bVar6 = ApplyEnclosesArgs(&pnodeFnc->super_ParseNode,this), !bVar6 &&
             (((ulong)(pSVar24->calleeUtf8SourceInfoList).ptr & 0x800000000000) != 0)) &&
            ((pnodeFnc->fncFlags & (kFunctionHasDefaultArguments|kFunctionHasDestructuredParams)) ==
             kFunctionNone)))) {
          uVar8 = Js::FunctionProxy::GetSourceContextId
                            ((FunctionProxy *)
                             (pSVar24->dynamicProfileInfoAllocator).
                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                             .freeList);
          LVar9 = Js::FunctionProxy::GetLocalFunctionId
                            ((FunctionProxy *)
                             (pSVar24->dynamicProfileInfoAllocator).
                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                             .freeList);
          pcVar20 = (char *)(ulong)LVar9;
          bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_01436260,CachedScopePhase,uVar8,LVar9);
          if ((bVar6) || (bVar6 = IsInDebugMode(this), innerScope = (ArenaMemoryData *)sym, !bVar6))
          {
            pFVar12 = FuncInfo::GetParsedFunctionBody((FuncInfo *)pSVar24);
            pSVar18 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)pFVar12);
            innerScope = (ArenaMemoryData *)sym;
            if (pSVar18->threadContext->TTDLog == (EventLog *)0x0) {
              bVar6 = Js::FunctionProxy::IsCoroutine
                                ((FunctionProxy *)
                                 (pSVar24->dynamicProfileInfoAllocator).
                                 super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                 .freeList);
              uVar22 = (uint)!bVar6 << 8;
            }
          }
        }
        *(uint *)((long)&(pSVar24->calleeUtf8SourceInfoList).ptr + 4) =
             *(uint *)((long)&(pSVar24->calleeUtf8SourceInfoList).ptr + 4) & 0xfffffeff | uVar22;
        if (uVar22 != 0) {
          if (*(RegSlot *)&pSVar24->DispatchDefaultInvoke != 0xffffffff) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar11 = 1;
            pcVar20 = "funcInfo->funcObjRegister == Js::Constants::NoRegister";
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0xe19,"(funcInfo->funcObjRegister == Js::Constants::NoRegister)",
                               "funcInfo->funcObjRegister == Js::Constants::NoRegister");
            if (!bVar6) goto LAB_007638ac;
            *puVar11 = 0;
            innerScope = (ArenaMemoryData *)sym;
          }
          pSVar14 = ParseNodeFnc::GetFuncSymbol
                              ((ParseNodeFnc *)
                               (pSVar24->dynamicProfileInfoAllocator).
                               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                               .freeListSize);
          if (((pSVar14 == (Symbol *)0x0) || ((pSVar14->field_0x42 & 0x20) == 0)) ||
             (pSVar14->location == 0xffffffff)) {
            RVar10 = FuncInfo::NextVarRegister((FuncInfo *)pSVar24);
            *(RegSlot *)&pSVar24->DispatchDefaultInvoke = RVar10;
            if (RVar10 == 0xffffffff) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar11 = 1;
              pcVar20 = "funcInfo->funcObjRegister != Js::Constants::NoRegister";
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                                 ,0xe2a,"(funcInfo->funcObjRegister != Js::Constants::NoRegister)",
                                 "funcInfo->funcObjRegister != Js::Constants::NoRegister");
              if (!bVar6) goto LAB_007638ac;
              *puVar11 = 0;
              innerScope = (ArenaMemoryData *)sym;
            }
          }
          else {
            *(RegSlot *)&pSVar24->DispatchDefaultInvoke = pSVar14->location;
          }
        }
        if (((ulong)(pSVar24->calleeUtf8SourceInfoList).ptr & 0x800000000) != 0) {
          pBStack_68 = (ByteCodeGenerator *)&stack0xffffffffffffffc8;
          _auStack_70 = this;
          for (pPVar16 = pnodeFnc->pnodeParams; pPVar16 != (ParseNode *)0x0;
              pPVar16 = ParseNode::GetFormalNext(pPVar16)) {
            StartEmitFunction::anon_class_16_2_85211fcd::operator()
                      ((anon_class_16_2_85211fcd *)auStack_70,pPVar16);
          }
          if (pnodeFnc->pnodeRest != (ParseNode *)0x0) {
            StartEmitFunction::anon_class_16_2_85211fcd::operator()
                      ((anon_class_16_2_85211fcd *)auStack_70,pnodeFnc->pnodeRest);
          }
          innerScope = (ArenaMemoryData *)sym;
          for (pPVar16 = pnodeFnc->pnodeParams; pPVar16 != (ParseNode *)0x0;
              pPVar16 = ParseNode::GetFormalNext(pPVar16)) {
            if (pPVar16->nop == knopParamPattern) {
              pPVar17 = ParseNode::AsParseNodeParamPattern(pPVar16);
              handler_01.funcInfo = (FuncInfo **)pcVar20;
              handler_01.this = (ByteCodeGenerator *)&stack0xffffffffffffffc8;
              Parser::MapBindIdentifier<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__1>
                        ((Parser *)(pPVar17->super_ParseNodeUni).pnode1,(ParseNodePtr)this,
                         handler_01);
            }
          }
          pPVar2 = pnodeFnc->pnodeRest;
          if ((pPVar2 != (ParseNode *)0x0) && (pPVar2->nop == knopParamPattern)) {
            pPVar17 = ParseNode::AsParseNodeParamPattern(pPVar2);
            handler_02.funcInfo = (FuncInfo **)pcVar20;
            handler_02.this = (ByteCodeGenerator *)&stack0xffffffffffffffc8;
            Parser::MapBindIdentifier<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__1>
                      ((Parser *)(pPVar17->super_ParseNodeUni).pnode1,(ParseNodePtr)this,handler_02)
            ;
          }
          pSVar14 = (Symbol *)
                    (local_38->isInstInlineCacheAllocator).
                    super_ArenaAllocatorBase<Memory::StandAloneFreeListPolicy,_4UL,_false,_0UL>.
                    super_ArenaData.fullBlocks;
          if (pSVar14 == (Symbol *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar11 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0xe41,"(sym)","sym");
            if (!bVar6) goto LAB_007638ac;
            *puVar11 = 0;
            innerScope = (ArenaMemoryData *)sym;
          }
          bVar6 = Symbol::NeedsSlotAlloc(pSVar14,this,(FuncInfo *)local_38);
          pSVar24 = local_38;
          if (bVar6) {
            Symbol::EnsureScopeSlot(pSVar14,this,(FuncInfo *)local_38);
            pSVar24 = local_38;
          }
        }
        pSVar14 = ParseNodeFnc::GetFuncSymbol
                            ((ParseNodeFnc *)
                             (pSVar24->dynamicProfileInfoAllocator).
                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                             .freeListSize);
        if ((pSVar14 != (Symbol *)0x0) &&
           (bVar6 = Symbol::NeedsSlotAlloc(pSVar14,this,(FuncInfo *)local_38), bVar6)) {
          lVar3 = *(long *)&(local_38->dynamicProfileInfoAllocator).
                            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                            .needsDelayFreeList;
          if ((lVar3 == 0) || ((*(byte *)(lVar3 + 0x44) & 2) == 0)) {
            if (((ulong)(local_38->calleeUtf8SourceInfoList).ptr & 0x20000000000) != 0) {
              Symbol::EnsureScopeSlot(pSVar14,this,(FuncInfo *)local_38);
            }
          }
          else {
            pSVar14->scopeSlot = 0;
          }
        }
        if (((ulong)(local_38->calleeUtf8SourceInfoList).ptr & 0x800000000) == 0) {
          pBStack_68 = (ByteCodeGenerator *)local_72;
          local_72 = (undefined1  [2])0x1;
          pBVar21 = (ByteCodeGenerator *)local_48;
          local_58 = (FuncInfo **)&stack0xffffffffffffffc8;
          _auStack_70 = pBVar21;
          local_60 = this;
          for (pPVar16 = pnodeFnc->pnodeParams; pPVar16 != (ParseNode *)0x0;
              pPVar16 = ParseNode::GetFormalNext(pPVar16)) {
            StartEmitFunction::anon_class_32_4_532d1dbc::operator()
                      ((anon_class_32_4_532d1dbc *)auStack_70,pPVar16);
          }
          if (pnodeFnc->pnodeRest != (ParseNode *)0x0) {
            StartEmitFunction::anon_class_32_4_532d1dbc::operator()
                      ((anon_class_32_4_532d1dbc *)auStack_70,pnodeFnc->pnodeRest);
          }
          innerScope = (ArenaMemoryData *)sym;
          for (pPVar16 = pnodeFnc->pnodeParams; pPVar16 != (ParseNode *)0x0;
              pPVar16 = ParseNode::GetFormalNext(pPVar16)) {
            if (pPVar16->nop == knopParamPattern) {
              pPVar17 = ParseNode::AsParseNodeParamPattern(pPVar16);
              handler_03.funcInfo = (FuncInfo **)pBVar21;
              handler_03.this = (ByteCodeGenerator *)&stack0xffffffffffffffc8;
              Parser::MapBindIdentifier<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__3>
                        ((Parser *)(pPVar17->super_ParseNodeUni).pnode1,(ParseNodePtr)this,
                         handler_03);
            }
          }
          pPVar2 = pnodeFnc->pnodeRest;
          if ((pPVar2 != (ParseNode *)0x0) && (pPVar2->nop == knopParamPattern)) {
            pPVar17 = ParseNode::AsParseNodeParamPattern(pPVar2);
            handler_04.funcInfo = (FuncInfo **)pBVar21;
            handler_04.this = (ByteCodeGenerator *)&stack0xffffffffffffffc8;
            Parser::MapBindIdentifier<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__3>
                      ((Parser *)(pPVar17->super_ParseNodeUni).pnode1,(ParseNodePtr)this,handler_04)
            ;
          }
        }
        ppPVar19 = &pnodeFnc->pnodeVars;
        while (pSVar24 = (ScriptContext *)*ppPVar19, local_48 = (undefined1  [8])pSVar24,
              pSVar24 != (ScriptContext *)0x0) {
          pPVar15 = ParseNode::AsParseNodeVar((ParseNode *)pSVar24);
          pSVar14 = pPVar15->sym;
          pPVar15 = ParseNode::AsParseNodeVar((ParseNode *)pSVar24);
          uVar7 = *(ushort *)&pSVar14->field_0x42;
          if ((pPVar15->isBlockScopeFncDeclVar == '\0') || ((uVar7 & 2) == 0)) {
            if (((uVar7 & 0x40) != 0) ||
               (((uVar7 & 2) != 0 &&
                (*(OpCode *)&(((SymbolName *)&pSVar24->super_ScriptContextInfo)->string).ptr ==
                 knopVarDecl)))) {
              pSVar14 = Scope::FindLocalSymbol
                                  ((Scope *)(local_38->dynamicProfileInfoAllocator).
                                            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                            .memoryData,&pSVar14->name);
            }
            if ((pSVar14->symbolType == STVariable) &&
               (bVar6 = Symbol::IsArguments(pSVar14), !bVar6)) {
              Symbol::EnsureScopeSlot(pSVar14,this,(FuncInfo *)local_38);
            }
          }
          pPVar15 = ParseNode::AsParseNodeVar((ParseNode *)pSVar24);
          ppPVar19 = &pPVar15->pnodeNext;
        }
        _auStack_70 = (ByteCodeGenerator *)local_48;
        local_60 = (ByteCodeGenerator *)&stack0xffffffffffffffc8;
        pBStack_68 = this;
        StartEmitFunction::anon_class_24_3_8900e8ef::operator()
                  ((anon_class_24_3_8900e8ef *)auStack_70,pnodeFnc->pnodeScopes->pnodeScopes);
        if (pnodeFnc->pnodeBodyScope != (ParseNodeBlock *)0x0) {
          StartEmitFunction::anon_class_24_3_8900e8ef::operator()
                    ((anon_class_24_3_8900e8ef *)auStack_70,pnodeFnc->pnodeBodyScope->pnodeScopes);
        }
        pSVar23 = local_50;
        if (pnodeFnc->pnodeBody != (ParseNodePtr)0x0) {
          if ((pnodeFnc->pnodeScopes->super_ParseNodeStmt).super_ParseNode.nop != knopBlock) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar11 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0xe98,"(pnodeFnc->pnodeScopes->nop == knopBlock)",
                               "pnodeFnc->pnodeScopes->nop == knopBlock");
            if (!bVar6) goto LAB_007638ac;
            *puVar11 = 0;
            innerScope = (ArenaMemoryData *)sym;
          }
          goto LAB_007636cc;
        }
      }
      if (*(RegSlot *)&local_38->DeferredParsingThunk == 0xffffffff) {
        if (((pnodeFnc->isBodyAndParamScopeMerged != false) ||
            (*(uint *)&innerScope->freelistCount != 0)) &&
           ((*(ushort *)((long)&innerScope->resetCount + 4) =
                  (ushort)*(undefined4 *)((long)&innerScope->resetCount + 4) & 0xffef |
                  (ushort)(*(RegSlot *)((long)&local_38->DeferredParsingThunk + 4) != 0xffffffff) <<
                  4, pSVar23 != (Scope *)0x0 &&
            ((pnodeFnc->isBodyAndParamScopeMerged != false &&
             ((*(uint *)&pSVar23->field_0x44 >> 10 & 1) != 0)))))) {
          *(ushort *)&pSVar23->field_0x44 =
               (ushort)*(uint *)&pSVar23->field_0x44 & 0xffef |
               (ushort)(*(RegSlot *)((long)&local_38->DeferredParsingThunk + 4) != 0xffffffff) << 4;
        }
      }
      else {
        *(byte *)((long)&innerScope->resetCount + 4) =
             *(byte *)((long)&innerScope->resetCount + 4) | 0x10;
      }
      pSVar24 = local_38;
      if (pnodeFnc->isBodyAndParamScopeMerged == false) {
        uVar7 = *(ushort *)&pSVar23->field_0x44;
        if (*(RegSlot *)&local_38->DeferredParsingThunk == 0xffffffff) {
          uVar7 = uVar7 & 0xffef | uVar7 >> 4 & 0x10;
        }
        else {
          uVar7 = uVar7 | 0x10;
        }
        *(ushort *)&pSVar23->field_0x44 = uVar7;
      }
    }
  }
  PushFuncInfo(this,L"StartEmitFunction",(FuncInfo *)pSVar24);
  if (((ulong)(local_38->calleeUtf8SourceInfoList).ptr & 0x800000000000) == 0) {
    pPVar4 = pnodeFnc->pnodeScopes;
    if ((~pPVar4->field_0x5c & 3) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0xf00,"(paramBlock->blockType == Parameter)",
                         "paramBlock->blockType == Parameter");
      if (!bVar6) goto LAB_007638ac;
      *puVar11 = 0;
    }
    pSVar23 = local_50;
    PushScope(this,local_50);
    EmitScopeList(this,pPVar4->pnodeScopes,(ParseNode *)pnodeFnc->pnodeBodyScope);
    if (this->currentScope != pSVar23) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0xf07,"(this->GetCurrentScope() == paramScope)",
                         "this->GetCurrentScope() == paramScope");
      if (!bVar6) {
LAB_007638ac:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar11 = 0;
    }
  }
  PushScope(this,(Scope *)innerScope);
  return;
}

Assistant:

void ByteCodeGenerator::StartEmitFunction(ParseNodeFnc *pnodeFnc)
{
    Assert(pnodeFnc->nop == knopFncDecl || pnodeFnc->nop == knopProg);

    FuncInfo *funcInfo = pnodeFnc->funcInfo;
    Scope * const bodyScope = funcInfo->GetBodyScope();
    Scope * const paramScope = funcInfo->GetParamScope();

    if (funcInfo->byteCodeFunction->IsFunctionParsed() && funcInfo->root->pnodeBody != nullptr)
    {
        if (funcInfo->GetParsedFunctionBody()->GetByteCode() == nullptr && !(flags & (fscrEval | fscrImplicitThis)))
        {
            // Only set the environment depth if it's truly known (i.e., not in eval or event handler).
            funcInfo->GetParsedFunctionBody()->SetEnvDepth(this->envDepth);
        }

        if (funcInfo->GetCallsEval())
        {
            funcInfo->byteCodeFunction->SetDontInline(true);
        }

        Scope * const funcExprScope = funcInfo->funcExprScope;
        if (funcExprScope)
        {
            if (funcInfo->GetCallsEval())
            {
                Assert(funcExprScope->GetIsObject());
            }

            if (funcExprScope->GetIsObject())
            {
                funcExprScope->SetCapturesAll(true);
                funcExprScope->SetMustInstantiate(true);
                PushScope(funcExprScope);
            }
            else
            {
                Symbol *sym = funcInfo->root->GetFuncSymbol();
                if (funcInfo->IsBodyAndParamScopeMerged())
                {
                    funcInfo->bodyScope->AddSymbol(sym);
                }
                else
                {
                    funcInfo->paramScope->AddSymbol(sym);
                }
                sym->EnsureScopeSlot(this, funcInfo);
                if (sym->GetHasNonLocalReference())
                {
                    sym->GetScope()->SetHasOwnLocalInClosure(true);
                }
            }
        }

        if (pnodeFnc->nop != knopProg)
        {
            if (!bodyScope->GetIsObject() && NeedObjectAsFunctionScope(funcInfo, pnodeFnc))
            {
                Assert(bodyScope->GetIsObject());
            }

            if (bodyScope->GetIsObject())
            {
                bodyScope->SetLocation(funcInfo->frameObjRegister);
            }
            else
            {
                bodyScope->SetLocation(funcInfo->frameSlotsRegister);
            }

            if (!funcInfo->IsBodyAndParamScopeMerged())
            {
                if (paramScope->GetIsObject())
                {
                    paramScope->SetLocation(funcInfo->frameObjRegister);
                }
                else
                {
                    paramScope->SetLocation(funcInfo->frameSlotsRegister);
                }
            }

            if (bodyScope->GetIsObject())
            {
                // Win8 908700: Disable under F12 debugger because there are too many cached scopes holding onto locals.
                funcInfo->SetHasCachedScope(
                    !PHASE_OFF(Js::CachedScopePhase, funcInfo->byteCodeFunction) &&
                    !funcInfo->Escapes() &&
                    funcInfo->frameObjRegister != Js::Constants::NoRegister &&
                    !ApplyEnclosesArgs(pnodeFnc, this) &&
                    funcInfo->IsBodyAndParamScopeMerged() && // There is eval in the param scope
                    !pnodeFnc->HasDefaultArguments() &&
                    !pnodeFnc->HasDestructuredParams() &&
                    (PHASE_FORCE(Js::CachedScopePhase, funcInfo->byteCodeFunction) || !IsInDebugMode())
#if ENABLE_TTD
                    && !funcInfo->GetParsedFunctionBody()->GetScriptContext()->GetThreadContext()->IsRuntimeInTTDMode()
#endif
                    && !funcInfo->byteCodeFunction->IsCoroutine()
                );

                if (funcInfo->GetHasCachedScope())
                {
                    Assert(funcInfo->funcObjRegister == Js::Constants::NoRegister);
                    Symbol *funcSym = funcInfo->root->GetFuncSymbol();
                    if (funcSym && funcSym->GetIsFuncExpr())
                    {
                        if (funcSym->GetLocation() == Js::Constants::NoRegister)
                        {
                            funcInfo->funcObjRegister = funcInfo->NextVarRegister();
                        }
                        else
                        {
                            funcInfo->funcObjRegister = funcSym->GetLocation();
                        }
                    }
                    else
                    {
                        funcInfo->funcObjRegister = funcInfo->NextVarRegister();
                    }
                    Assert(funcInfo->funcObjRegister != Js::Constants::NoRegister);
                }

                ParseNode *pnode;
                Symbol *sym;

                if (funcInfo->GetHasArguments())
                {
                    // Process function's formal parameters
                    MapFormals(pnodeFnc, [&](ParseNode *pnode)
                    {
                        if (pnode->IsVarLetOrConst())
                        {
                            pnode->AsParseNodeVar()->sym->EnsureScopeSlot(this, funcInfo);
                        }
                    });

                    MapFormalsFromPattern(pnodeFnc, [&](ParseNode *pnode) { pnode->AsParseNodeVar()->sym->EnsureScopeSlot(this, funcInfo); });

                    // Only allocate scope slot for "arguments" when really necessary. "hasDeferredChild"
                    // doesn't require scope slot for "arguments" because inner functions can't access
                    // outer function's arguments directly.
                    sym = funcInfo->GetArgumentsSymbol();
                    Assert(sym);
                    if (sym->NeedsSlotAlloc(this, funcInfo))
                    {
                        sym->EnsureScopeSlot(this, funcInfo);
                    }
                }

                sym = funcInfo->root->GetFuncSymbol();

                if (sym && sym->NeedsSlotAlloc(this, funcInfo))
                {
                    if (funcInfo->funcExprScope && funcInfo->funcExprScope->GetIsObject())
                    {
                        sym->SetScopeSlot(0);
                    }
                    else if (funcInfo->GetFuncExprNameReference())
                    {
                        sym->EnsureScopeSlot(this, funcInfo);
                    }
                }

                if (!funcInfo->GetHasArguments())
                {
                    Symbol *formal;
                    Js::ArgSlot pos = 1;
                    auto moveArgToReg = [&](ParseNode *pnode)
                    {
                        if (pnode->IsVarLetOrConst())
                        {
                            formal = pnode->AsParseNodeVar()->sym;
                            // Get the param from its argument position into its assigned register.
                            // The position should match the location; otherwise, it has been shadowed by parameter with the same name.
                            if (formal->GetLocation() + 1 == pos)
                            {
                                pnode->AsParseNodeVar()->sym->EnsureScopeSlot(this, funcInfo);
                            }
                        }
                        pos++;
                    };
                    MapFormals(pnodeFnc, moveArgToReg);
                    MapFormalsFromPattern(pnodeFnc, [&](ParseNode *pnode) { pnode->AsParseNodeVar()->sym->EnsureScopeSlot(this, funcInfo); });
                }

                for (pnode = pnodeFnc->pnodeVars; pnode; pnode = pnode->AsParseNodeVar()->pnodeNext)
                {
                    sym = pnode->AsParseNodeVar()->sym;
                    if (!(pnode->AsParseNodeVar()->isBlockScopeFncDeclVar && sym->GetIsBlockVar()))
                    {
                        if (sym->GetIsCatch() || (pnode->nop == knopVarDecl && sym->GetIsBlockVar()))
                        {
                            sym = funcInfo->bodyScope->FindLocalSymbol(sym->GetName());
                        }
                        if (sym->GetSymbolType() == STVariable && !sym->IsArguments())
                        {
                            sym->EnsureScopeSlot(this, funcInfo);
                        }
                    }
                }
                auto ensureFncDeclScopeSlots = [&](ParseNode *pnodeScope)
                {
                    for (pnode = pnodeScope; pnode;)
                    {
                        switch (pnode->nop)
                        {
                        case knopFncDecl:
                            if (pnode->AsParseNodeFnc()->IsDeclaration())
                            {
                                EnsureFncDeclScopeSlot(pnode->AsParseNodeFnc(), funcInfo);
                            }
                            pnode = pnode->AsParseNodeFnc()->pnodeNext;
                            break;
                        case knopBlock:
                            pnode = pnode->AsParseNodeBlock()->pnodeNext;
                            break;
                        case knopCatch:
                            pnode = pnode->AsParseNodeCatch()->pnodeNext;
                            break;
                        case knopWith:
                            pnode = pnode->AsParseNodeWith()->pnodeNext;
                            break;
                        }
                    }
                };
                pnodeFnc->MapContainerScopes(ensureFncDeclScopeSlots);

                if (pnodeFnc->pnodeBody)
                {
                    Assert(pnodeFnc->pnodeScopes->nop == knopBlock);
                    this->EnsureLetConstScopeSlots(pnodeFnc->pnodeBodyScope, funcInfo);
                }
            }
            else
            {
                ParseNode *pnode;
                Symbol *sym;

                pnodeFnc->MapContainerScopes([&](ParseNode *pnodeScope) { this->EnsureFncScopeSlots(pnodeScope, funcInfo); });

                for (pnode = pnodeFnc->pnodeVars; pnode; pnode = pnode->AsParseNodeVar()->pnodeNext)
                {
                    sym = pnode->AsParseNodeVar()->sym;
                    if (!(pnode->AsParseNodeVar()->isBlockScopeFncDeclVar && sym->GetIsBlockVar()))
                    {
                        if (sym->GetIsCatch() || (pnode->nop == knopVarDecl && sym->GetIsBlockVar()))
                        {
                            sym = funcInfo->bodyScope->FindLocalSymbol(sym->GetName());
                        }
                        if (sym->GetSymbolType() == STVariable && sym->NeedsSlotAlloc(this, funcInfo) && !sym->IsArguments())
                        {
                            sym->EnsureScopeSlot(this, funcInfo);
                        }
                    }
                }

                auto ensureScopeSlot = [&](ParseNode *pnode)
                {
                    if (pnode->IsVarLetOrConst())
                    {
                        sym = pnode->AsParseNodeVar()->sym;
                        if (sym->GetSymbolType() == STFormal && sym->NeedsSlotAlloc(this, funcInfo))
                        {
                            sym->EnsureScopeSlot(this, funcInfo);
                        }
                    }
                };
                // Process function's formal parameters
                MapFormals(pnodeFnc, ensureScopeSlot);
                MapFormalsFromPattern(pnodeFnc, ensureScopeSlot);

                if (funcInfo->GetHasArguments())
                {
                    sym = funcInfo->GetArgumentsSymbol();
                    Assert(sym);

                    // There is no eval so the arguments may be captured in a lambda.
                    // But we cannot relay on slots getting allocated while the lambda is emitted as the function body may be reparsed.
                    sym->EnsureScopeSlot(this, funcInfo);
                }

                if (pnodeFnc->pnodeBody)
                {
                    this->EnsureLetConstScopeSlots(pnodeFnc->pnodeScopes, funcInfo);
                    this->EnsureLetConstScopeSlots(pnodeFnc->pnodeBodyScope, funcInfo);
                }
            }

            // When we have split scope and body scope does not have any scope slots allocated, we don't have to mark the body scope as mustinstantiate.
            if (funcInfo->frameObjRegister != Js::Constants::NoRegister)
            {
                bodyScope->SetMustInstantiate(true);
            }
            else if (pnodeFnc->IsBodyAndParamScopeMerged() || bodyScope->GetScopeSlotCount() != 0)
            {
                bodyScope->SetMustInstantiate(funcInfo->frameSlotsRegister != Js::Constants::NoRegister);

                if (pnodeFnc->IsBodyAndParamScopeMerged() && paramScope && paramScope->GetHasNestedParamFunc())
                {
                    paramScope->SetMustInstantiate(funcInfo->frameSlotsRegister != Js::Constants::NoRegister);
                }
            }

            if (!pnodeFnc->IsBodyAndParamScopeMerged())
            {
                if (funcInfo->frameObjRegister != Js::Constants::NoRegister)
                {
                    paramScope->SetMustInstantiate(true);
                }
                else
                {
                    // In the case of function expression being captured in the param scope the hasownlocalinclosure will be false for param scope,
                    // as function expression symbol stays in the function expression scope. We don't have to set mustinstantiate for param scope in that case.
                    paramScope->SetMustInstantiate(paramScope->GetHasOwnLocalInClosure());
                }
            }
        }
        else
        {
            bool newScopeForEval = (funcInfo->byteCodeFunction->GetIsStrictMode() && (this->GetFlags() & fscrEval));

            if (newScopeForEval)
            {
                Assert(bodyScope->GetIsObject());
            }
        }
    }

    PushFuncInfo(_u("StartEmitFunction"), funcInfo);

    if (!funcInfo->IsBodyAndParamScopeMerged())
    {
        ParseNodeBlock * paramBlock = pnodeFnc->pnodeScopes;
        Assert(paramBlock->blockType == Parameter);

        PushScope(paramScope);

        // While emitting the functions we have to stop when we see the body scope block.
        // Otherwise functions defined in the body scope will not be able to get the right references.
        this->EmitScopeList(paramBlock->pnodeScopes, pnodeFnc->pnodeBodyScope);
        Assert(this->GetCurrentScope() == paramScope);
    }

    PushScope(bodyScope);
}